

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O1

int mapRiver(Layer *l,int *out,int x,int z,int w,int h)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int *piVar13;
  
  iVar2 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar2 == 0) {
    if (0 < h) {
      cVar1 = l->mc;
      lVar4 = (long)w;
      piVar8 = out + lVar4 * 2 + 5;
      piVar9 = out + lVar4 + 4;
      lVar10 = 0;
      piVar13 = out;
      do {
        if (0 < w) {
          lVar11 = 0;
          do {
            uVar7 = piVar9[lVar11 + -2];
            uVar12 = piVar9[lVar11 + -1];
            uVar6 = piVar9[lVar11];
            uVar3 = out[lVar11 + 1];
            uVar5 = piVar8[lVar11];
            if (cVar1 < '\n') {
              iVar2 = 7;
              if (uVar12 != 0) goto LAB_00108878;
            }
            else {
              if (1 < (int)uVar7) {
                uVar7 = uVar7 & 1 | 2;
              }
              if (1 < (int)uVar12) {
                uVar12 = uVar12 & 1 | 2;
              }
              if (1 < (int)uVar6) {
                uVar6 = uVar6 & 1 | 2;
              }
              if (1 < (int)uVar3) {
                uVar3 = uVar3 & 1 | 2;
              }
              if (1 < (int)uVar5) {
                uVar5 = uVar5 & 1 | 2;
              }
LAB_00108878:
              iVar2 = (uint)(uVar6 != uVar12 ||
                            (uVar5 != uVar12 || (uVar3 != uVar12 || uVar7 != uVar12))) * 8 + -1;
            }
            piVar13[lVar11] = iVar2;
            lVar11 = lVar11 + 1;
          } while (lVar4 != lVar11);
        }
        lVar10 = lVar10 + 1;
        piVar13 = piVar13 + lVar4;
        piVar8 = piVar8 + lVar4 + 2;
        out = out + lVar4 + 2;
        piVar9 = piVar9 + lVar4 + 2;
      } while (lVar10 != h);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mapRiver(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    int mc = l->mc;

    for (j = 0; j < h; j++)
    {
        int *vz0 = out + (j+0)*pW;
        int *vz1 = out + (j+1)*pW;
        int *vz2 = out + (j+2)*pW;

        for (i = 0; i < w; i++)
        {
            int v01 = vz1[i+0];
            int v11 = vz1[i+1];
            int v21 = vz1[i+2];
            int v10 = vz0[i+1];
            int v12 = vz2[i+1];

            if (mc >= MC_1_7)
            {
                v01 = reduceID(v01);
                v11 = reduceID(v11);
                v21 = reduceID(v21);
                v10 = reduceID(v10);
                v12 = reduceID(v12);
            }
            else if (v11 == 0)
            {
                out[i + j * w] = river;
                continue;
            }

            if (v11 == v01 && v11 == v10 && v11 == v12 && v11 == v21)
            {
                out[i + j * w] = -1;
            }
            else
            {
                out[i + j * w] = river;
            }
        }
    }

    return 0;
}